

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

int get_port(SOCKET sockfd,uint16_t *port)

{
  uint16_t uVar1;
  int iVar2;
  socklen_t local_9c;
  int code;
  socklen_t len;
  sockaddr_storage sockinfo;
  uint16_t *port_local;
  SOCKET sockfd_local;
  
  local_9c = 0x80;
  sockinfo.__ss_align = (unsigned_long)port;
  iVar2 = getsockname(sockfd,(sockaddr *)&code,&local_9c);
  if (iVar2 == -1) {
    port_local._4_4_ = -1;
  }
  else {
    if ((short)code == 2) {
      uVar1 = ntohs(code._2_2_);
      *(uint16_t *)sockinfo.__ss_align = uVar1;
    }
    else if ((short)code == 10) {
      uVar1 = ntohs(code._2_2_);
      *(uint16_t *)sockinfo.__ss_align = uVar1;
    }
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x2e0,
               "sockfd = %d, .... port = %d\n",(ulong)(uint)sockfd,
               (uint)*(ushort *)sockinfo.__ss_align);
    port_local._4_4_ = 0;
  }
  return port_local._4_4_;
}

Assistant:

static int get_port(
	/*! [in] Socket descriptor. */
	SOCKET sockfd,
	/*! [out] The port value if successful, otherwise, untouched. */
	uint16_t *port)
{
	struct sockaddr_storage sockinfo;
	socklen_t len;
	int code;

	len = sizeof(sockinfo);
	code = getsockname(sockfd, (struct sockaddr *)&sockinfo, &len);
	if (code == -1) {
		return -1;
	}
	if (sockinfo.ss_family == AF_INET) {
		*port = ntohs(((struct sockaddr_in *)&sockinfo)->sin_port);
	} else if (sockinfo.ss_family == AF_INET6) {
		*port = ntohs(((struct sockaddr_in6 *)&sockinfo)->sin6_port);
	}
	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"sockfd = %d, .... port = %d\n",
		sockfd,
		(int)*port);

	return 0;
}